

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O1

BIGNUM * BN_mpi2bn(uchar *s,int len,BIGNUM *ret)

{
  byte bVar1;
  int iVar2;
  BIGNUM *ret_00;
  BIGNUM *pBVar3;
  undefined4 in_register_00000034;
  uint uVar4;
  
  if (CONCAT44(in_register_00000034,len) < 4) {
    iVar2 = 0x161;
  }
  else {
    uVar4 = *(uint *)s;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    if ((ulong)uVar4 == CONCAT44(in_register_00000034,len) - 4) {
      ret_00 = ret;
      if ((ret != (BIGNUM *)0x0) || (ret_00 = BN_new(), ret_00 != (BIGNUM *)0x0)) {
        if ((ulong)uVar4 == 0) {
          BN_zero((BIGNUM *)ret_00);
          return ret_00;
        }
        pBVar3 = BN_bin2bn(s + 4,uVar4,ret_00);
        if (pBVar3 != (BIGNUM *)0x0) {
          bVar1 = s[4];
          ret_00->neg = (uint)(bVar1 >> 7);
          if (-1 < (char)bVar1) {
            return ret_00;
          }
          iVar2 = BN_num_bits(ret_00);
          BN_clear_bit(ret_00,iVar2 + -1);
          return ret_00;
        }
        if (ret == (BIGNUM *)0x0) {
          BN_free(ret_00);
        }
      }
      return (BIGNUM *)0x0;
    }
    iVar2 = 0x169;
  }
  ERR_put_error(3,0,0x75,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                ,iVar2);
  return (BIGNUM *)0x0;
}

Assistant:

BIGNUM *BN_mpi2bn(const uint8_t *in, size_t len, BIGNUM *out) {
  if (len < 4) {
    OPENSSL_PUT_ERROR(BN, BN_R_BAD_ENCODING);
    return NULL;
  }
  const size_t in_len = ((size_t)in[0] << 24) | //
                        ((size_t)in[1] << 16) | //
                        ((size_t)in[2] << 8) | //
                        ((size_t)in[3]);
  if (in_len != len - 4) {
    OPENSSL_PUT_ERROR(BN, BN_R_BAD_ENCODING);
    return NULL;
  }

  int out_is_alloced = 0;
  if (out == NULL) {
    out = BN_new();
    if (out == NULL) {
      return NULL;
    }
    out_is_alloced = 1;
  }

  if (in_len == 0) {
    BN_zero(out);
    return out;
  }

  in += 4;
  if (BN_bin2bn(in, in_len, out) == NULL) {
    if (out_is_alloced) {
      BN_free(out);
    }
    return NULL;
  }
  out->neg = ((*in) & 0x80) != 0;
  if (out->neg) {
    BN_clear_bit(out, BN_num_bits(out) - 1);
  }
  return out;
}